

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall CLParam<double>::~CLParam(CLParam<double> *this)

{
  this->_vptr_CLParam = (_func_int **)&PTR__CLParam_00166630;
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->parameter_name);
  return;
}

Assistant:

virtual ~CLParam() {}